

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_transfer.cpp
# Opt level: O3

void Omega_h::transfer_common3<double>
               (Mesh *new_mesh,Int ent_dim,TagBase *tagbase,Write<double> *new_data)

{
  int *piVar1;
  Alloc *pAVar2;
  Int ncomps;
  string *name;
  Write<double> local_50;
  Read<signed_char> local_40;
  
  name = TagBase::name_abi_cxx11_(tagbase);
  ncomps = TagBase::ncomps(tagbase);
  local_50.shared_alloc_.alloc = (new_data->shared_alloc_).alloc;
  if (((ulong)local_50.shared_alloc_.alloc & 7) == 0 && local_50.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    if (entering_parallel == '\x01') {
      local_50.shared_alloc_.alloc = (Alloc *)((local_50.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_50.shared_alloc_.alloc)->use_count = (local_50.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_50.shared_alloc_.direct_ptr = (new_data->shared_alloc_).direct_ptr;
  Read<double>::Read(&local_40,&local_50);
  Mesh::add_tag<double>(new_mesh,ent_dim,name,ncomps,(Read<double> *)&local_40,true);
  if (((ulong)local_40.write_.shared_alloc_.alloc & 7) == 0 &&
      local_40.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_40.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_40.write_.shared_alloc_.alloc);
      operator_delete(local_40.write_.shared_alloc_.alloc,0x48);
    }
  }
  pAVar2 = local_50.shared_alloc_.alloc;
  if (((ulong)local_50.shared_alloc_.alloc & 7) == 0 && local_50.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_50.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_50.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  return;
}

Assistant:

void transfer_common3(
    Mesh* new_mesh, Int ent_dim, TagBase const* tagbase, Write<T> new_data) {
  auto const& name = tagbase->name();
  auto ncomps = tagbase->ncomps();
  new_mesh->add_tag(ent_dim, name, ncomps, Read<T>(new_data), true);
}